

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlUCSIsMiscellaneousMathematicalSymbolsA(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  PyObject *pPVar2;
  int code;
  undefined4 local_14;
  
  local_14 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = libxml_deprecationWarning("xmlUCSIsMiscellaneousMathematicalSymbolsA");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"i:xmlUCSIsMiscellaneousMathematicalSymbolsA",&local_14);
    if (iVar1 != 0) {
      iVar1 = xmlUCSIsMiscellaneousMathematicalSymbolsA(local_14);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlUCSIsMiscellaneousMathematicalSymbolsA(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int code;

    if (libxml_deprecationWarning("xmlUCSIsMiscellaneousMathematicalSymbolsA") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"i:xmlUCSIsMiscellaneousMathematicalSymbolsA", &code))
        return(NULL);

    c_retval = xmlUCSIsMiscellaneousMathematicalSymbolsA(code);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}